

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

int CVmObjDate::call_stat_prop(vm_val_t *result,uchar **pc_ptr,uint *argc,vm_prop_id_t prop)

{
  int iVar1;
  gregcaldate_t cal;
  undefined1 local_40 [28];
  undefined4 local_24;
  
  iVar1 = CVmMetaTable::prop_to_vector_idx(G_meta_table_X,metaclass_reg_->meta_reg_idx_,prop);
  if (iVar1 == 0xd) {
    s_getp_setLocaleInfo(result,argc);
  }
  else {
    if (iVar1 == 2) {
      local_40._0_8_ = &PTR__multicaldate_t_00329a58;
    }
    else {
      if (iVar1 != 1) {
        iVar1 = CVmObject::call_stat_prop(result,pc_ptr,argc,prop);
        return iVar1;
      }
      local_40._0_8_ = &PTR__multicaldate_t_003299d8;
    }
    local_40._20_8_ = 0x300000000;
    local_24 = 1;
    common_parseDate(result,argc,(multicaldate_t *)local_40);
  }
  return 1;
}

Assistant:

int CVmObjDate::call_stat_prop(VMG_ vm_val_t *result,
                               const uchar **pc_ptr, uint *argc,
                               vm_prop_id_t prop)
{
    /* look up the function */
    uint midx = G_meta_table
                ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop);

    /* check for our static properties */
    switch (midx)
    {
    case VMDATE_PARSEDATE:
        return s_getp_parseDate(vmg_ result, argc);
        
    case VMDATE_PARSEJULIANDATE:
        return s_getp_parseJulianDate(vmg_ result, argc);

    case VMDATE_SETLOCALINFO:
        return s_getp_setLocaleInfo(vmg_ result, argc);
    }

    /* not one of hours; inherit the superclass handling */
    return CVmObject::call_stat_prop(vmg_ result, pc_ptr, argc, prop);
}